

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void chaiscript::detail::Dispatch_Engine::
     add_keyed_value<std::vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                *t_c,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_key,
               shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *t_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  this;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
  local_50;
  
  this = std::
         __find_if<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>*,std::vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>,__gnu_cxx::__ops::_Iter_pred<chaiscript::detail::Dispatch_Engine::find_keyed_value<std::vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,std::__cxx11::string>(std::vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>&,std::__cxx11::string_const&)::_lambda(std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>const&)_1_>>
                   ((t_c->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start,
                    (t_c->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish,t_key);
  if (this._M_current !=
      (t_c->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_50.first.field_2;
    pcVar2 = (t_key->_M_dataplus)._M_p;
    local_50.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + t_key->_M_string_length);
    local_50.second.
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (t_value->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
    local_50.second.
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (t_value->
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    (t_value->
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (t_value->
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = (element_type *)0x0;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
    ::operator=(this._M_current,&local_50);
    if (local_50.second.
        super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.second.
                 super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.first._M_dataplus._M_p,
                      local_50.first.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  ::reserve(t_c,((long)this._M_current -
                 (long)(t_c->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 + 1);
  std::
  vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
  ::
  emplace_back<std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            ((vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
              *)t_c,t_key,t_value);
  return;
}

Assistant:

static void add_keyed_value(Container &t_c, const Key &t_key, Value &&t_value)
          {
            auto itr = find_keyed_value(t_c, t_key);

            if (itr == t_c.end()) {
              t_c.reserve(t_c.size() + 1); // tightly control growth of memory usage here
              t_c.emplace_back(t_key, std::forward<Value>(t_value));
            } else {
              typedef typename Container::value_type value_type;
              *itr = value_type(t_key, std::forward<Value>(t_value));
            }
          }